

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O1

TxMempoolInfo * __thiscall
CTxMemPool::info(TxMempoolInfo *__return_storage_ptr__,CTxMemPool *this,GenTxid *gtxid)

{
  const_iterator it;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock11;
  unique_lock<std::recursive_mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30._M_device = &(this->cs).super_recursive_mutex;
  local_30._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_30);
  if (gtxid->m_is_wtxid == true) {
    it.node = (hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
               *)boost::multi_index::detail::
                 hashed_index<mempoolentry_wtxid,SaltedTxidHasher,std::equal_to<uint256>,boost::multi_index::detail::nth_layer<2,CTxMemPoolEntry,CTxMemPool::CTxMemPoolEntry_Indices,std::allocator<CTxMemPoolEntry>>,boost::mpl::v_item<index_by_wtxid,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::hashed_unique_tag>
                 ::find<uint256,SaltedTxidHasher,std::equal_to<uint256>>
                           ((hashed_index<mempoolentry_wtxid,SaltedTxidHasher,std::equal_to<uint256>,boost::multi_index::detail::nth_layer<2,CTxMemPoolEntry,CTxMemPool::CTxMemPoolEntry_Indices,std::allocator<CTxMemPoolEntry>>,boost::mpl::v_item<index_by_wtxid,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::hashed_unique_tag>
                             *)&(this->mapTx).super_type,&gtxid->m_hash,
                            &(this->mapTx).super_type.super_type.hash_,
                            &(this->mapTx).super_type.super_type.field_0x18);
  }
  else {
    it.node = (hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
               *)boost::multi_index::detail::
                 hashed_index<mempoolentry_txid,SaltedTxidHasher,std::equal_to<uint256>,boost::multi_index::detail::nth_layer<1,CTxMemPoolEntry,CTxMemPool::CTxMemPoolEntry_Indices,std::allocator<CTxMemPoolEntry>>,boost::mpl::vector0<mpl_::na>,boost::multi_index::detail::hashed_unique_tag>
                 ::find<uint256,SaltedTxidHasher,std::equal_to<uint256>>
                           ((hashed_index<mempoolentry_txid,SaltedTxidHasher,std::equal_to<uint256>,boost::multi_index::detail::nth_layer<1,CTxMemPoolEntry,CTxMemPool::CTxMemPoolEntry_Indices,std::allocator<CTxMemPoolEntry>>,boost::mpl::vector0<mpl_::na>,boost::multi_index::detail::hashed_unique_tag>
                             *)&(this->mapTx).super_type,&gtxid->m_hash,
                            &(this->mapTx).super_type.hash_,&(this->mapTx).super_type.field_0x68);
  }
  if (it.node ==
      (this->mapTx).
      super_header_holder<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>_*,_boost::multi_index::multi_index_container<CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>_>
      .member) {
    *(undefined8 *)&__return_storage_ptr__->vsize = 0;
    __return_storage_ptr__->nFeeDelta = 0;
    (__return_storage_ptr__->m_time).__r = 0;
    __return_storage_ptr__->fee = 0;
    (__return_storage_ptr__->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    GetInfo(__return_storage_ptr__,it);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

TxMempoolInfo CTxMemPool::info(const GenTxid& gtxid) const
{
    LOCK(cs);
    indexed_transaction_set::const_iterator i = (gtxid.IsWtxid() ? get_iter_from_wtxid(gtxid.GetHash()) : mapTx.find(gtxid.GetHash()));
    if (i == mapTx.end())
        return TxMempoolInfo();
    return GetInfo(i);
}